

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

BYTE * __thiscall FFontChar2::GetColumn(FFontChar2 *this,uint column,Span **spans_out)

{
  Span **ppSVar1;
  Span **spans_out_local;
  uint column_local;
  FFontChar2 *this_local;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  spans_out_local._4_4_ = column;
  if ((this->super_FTexture).Width <= column) {
    spans_out_local._4_4_ = (uint)(this->super_FTexture).WidthMask;
  }
  if (spans_out != (Span **)0x0) {
    if (this->Spans == (Span **)0x0) {
      ppSVar1 = FTexture::CreateSpans(&this->super_FTexture,this->Pixels);
      this->Spans = ppSVar1;
    }
    *spans_out = this->Spans[spans_out_local._4_4_];
  }
  return this->Pixels + spans_out_local._4_4_ * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FFontChar2::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if (column >= Width)
	{
		column = WidthMask;
	}
	if (spans_out != NULL)
	{
		if (Spans == NULL)
		{
			Spans = CreateSpans (Pixels);
		}
		*spans_out = Spans[column];
	}
	return Pixels + column*Height;
}